

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::unroll_array_from_complex_load
          (CompilerGLSL *this,uint32_t target_id,uint32_t source_id,string *expr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Variant *pVVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  uint32_t uVar7;
  SPIRVariable *var;
  SPIRType *pSVar8;
  runtime_error *this_00;
  char (*in_R8) [10];
  string array_expr;
  string new_expr;
  uint32_t local_94;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  if ((((this->backend).force_gl_in_out_block == true) &&
      (uVar3 = (ulong)source_id,
      uVar3 < (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.buffer_size)) &&
     (pVVar2 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
     pVVar2[uVar3].type == TypeVariable)) {
    local_94 = target_id;
    var = Variant::get<spirv_cross::SPIRVariable>(pVVar2 + uVar3);
    if (var->storage == StorageClassInput) {
      pSVar8 = Compiler::get_variable_data_type(&this->super_Compiler,var);
      if ((pSVar8->array).super_VectorView<unsigned_int>.buffer_size != 0) {
        uVar7 = Compiler::get_decoration
                          (&this->super_Compiler,(ID)(var->super_IVariant).self.id,DecorationBuiltIn
                          );
        bVar4 = Compiler::is_builtin_variable(&this->super_Compiler,var);
        bVar5 = Compiler::is_tessellation_shader(&this->super_Compiler);
        bVar6 = Compiler::has_decoration
                          (&this->super_Compiler,(ID)(var->super_IVariant).self.id,DecorationPatch);
        if ((bVar5 || 1 >= uVar7 && bVar4) && (!bVar6)) {
          join<char_const(&)[2],unsigned_int&,char_const(&)[10]>
                    (&local_50,(spirv_cross *)0x2e3de5,(char (*) [2])&local_94,(uint *)"_unrolled",
                     in_R8);
          (*(this->super_Compiler)._vptr_Compiler[0x1a])
                    (&local_90,this,pSVar8,&local_50,(ulong)local_94);
          statement<std::__cxx11::string,char_const(&)[2]>(this,&local_90,(char (*) [2])0x2d9bde);
          paVar1 = &local_90.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != paVar1) {
            operator_delete(local_90._M_dataplus._M_p);
          }
          local_90._M_string_length = 0;
          local_90.field_2._M_local_buf[0] = '\0';
          local_90._M_dataplus._M_p = (pointer)paVar1;
          if ((pSVar8->array_size_literal).super_VectorView<bool>.ptr
              [(pSVar8->array_size_literal).super_VectorView<bool>.buffer_size - 1] == true) {
            convert_to_string<unsigned_int,_0>
                      (&local_70,
                       (pSVar8->array).super_VectorView<unsigned_int>.ptr +
                       ((pSVar8->array).super_VectorView<unsigned_int>.buffer_size - 1));
            ::std::__cxx11::string::operator=((string *)&local_90,(string *)&local_70);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p);
            }
            if ((pSVar8->array).super_VectorView<unsigned_int>.ptr
                [(pSVar8->array).super_VectorView<unsigned_int>.buffer_size - 1] == 0) {
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_70,"Cannot unroll an array copy from unsized array.","");
              ::std::runtime_error::runtime_error(this_00,(string *)&local_70);
              *(undefined ***)this_00 = &PTR__runtime_error_00357118;
              __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
          }
          else {
            to_expression_abi_cxx11_
                      (&local_70,this,
                       (pSVar8->array).super_VectorView<unsigned_int>.ptr
                       [(pSVar8->array).super_VectorView<unsigned_int>.buffer_size - 1],true);
            ::std::__cxx11::string::operator=((string *)&local_90,(string *)&local_70);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p);
            }
          }
          statement<char_const(&)[25],std::__cxx11::string&,char_const(&)[8]>
                    (this,(char (*) [25])"for (int i = 0; i < int(",&local_90,
                     (char (*) [8])"); i++)");
          statement<char_const(&)[2]>(this,(char (*) [2])"{");
          this->indent = this->indent + 1;
          if (1 < uVar7 || !bVar4) {
            statement<std::__cxx11::string&,char_const(&)[7],std::__cxx11::string&,char_const(&)[5]>
                      (this,&local_50,(char (*) [7])"[i] = ",expr,(char (*) [5])0x2ea112);
          }
          else {
            statement<std::__cxx11::string&,char_const(&)[16],std::__cxx11::string&,char_const(&)[2]>
                      (this,&local_50,(char (*) [16])"[i] = gl_in[i].",expr,(char (*) [2])0x2d9bde);
          }
          end_scope(this);
          ::std::__cxx11::string::operator=((string *)expr,(string *)&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != paVar1) {
            operator_delete(local_90._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void CompilerGLSL::unroll_array_from_complex_load(uint32_t target_id, uint32_t source_id, std::string &expr)
{
	if (!backend.force_gl_in_out_block)
		return;
	// This path is only relevant for GL backends.

	auto *var = maybe_get<SPIRVariable>(source_id);
	if (!var)
		return;

	if (var->storage != StorageClassInput)
		return;

	auto &type = get_variable_data_type(*var);
	if (type.array.empty())
		return;

	auto builtin = BuiltIn(get_decoration(var->self, DecorationBuiltIn));
	bool is_builtin = is_builtin_variable(*var) && (builtin == BuiltInPointSize || builtin == BuiltInPosition);
	bool is_tess = is_tessellation_shader();
	bool is_patch = has_decoration(var->self, DecorationPatch);

	// Tessellation input arrays are special in that they are unsized, so we cannot directly copy from it.
	// We must unroll the array load.
	// For builtins, we couldn't catch this case normally,
	// because this is resolved in the OpAccessChain in most cases.
	// If we load the entire array, we have no choice but to unroll here.
	if (!is_patch && (is_builtin || is_tess))
	{
		auto new_expr = join("_", target_id, "_unrolled");
		statement(variable_decl(type, new_expr, target_id), ";");
		string array_expr;
		if (type.array_size_literal.back())
		{
			array_expr = convert_to_string(type.array.back());
			if (type.array.back() == 0)
				SPIRV_CROSS_THROW("Cannot unroll an array copy from unsized array.");
		}
		else
			array_expr = to_expression(type.array.back());

		// The array size might be a specialization constant, so use a for-loop instead.
		statement("for (int i = 0; i < int(", array_expr, "); i++)");
		begin_scope();
		if (is_builtin)
			statement(new_expr, "[i] = gl_in[i].", expr, ";");
		else
			statement(new_expr, "[i] = ", expr, "[i];");
		end_scope();

		expr = move(new_expr);
	}
}